

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matfx.cpp
# Opt level: O0

void __thiscall rw::MatFX::getUVTransformMatrices(MatFX *this,Matrix **base,Matrix **dual)

{
  int32 iVar1;
  int32 i;
  Matrix **dual_local;
  Matrix **base_local;
  MatFX *this_local;
  
  iVar1 = getEffectIndex(this,5);
  if (iVar1 < 0) {
    if (base != (Matrix **)0x0) {
      *base = (Matrix *)0x0;
    }
    if (dual != (Matrix **)0x0) {
      *dual = (Matrix *)0x0;
    }
  }
  else {
    if (base != (Matrix **)0x0) {
      *base = (Matrix *)this->fx[iVar1].field_1.bump.frame;
    }
    if (dual != (Matrix **)0x0) {
      *dual = (Matrix *)this->fx[iVar1].field_1.bump.bumpedTex;
    }
  }
  return;
}

Assistant:

void
MatFX::getUVTransformMatrices(Matrix **base, Matrix **dual)
{
	int32 i = this->getEffectIndex(UVTRANSFORM);
	if(i >= 0){
		if(base) *base = this->fx[i].uvtransform.baseTransform;
		if(dual) *dual = this->fx[i].uvtransform.dualTransform;
		return;
	}
	if(base) *base = nil;
	if(dual) *dual = nil;
}